

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

bool __thiscall duckdb::IEJoinUnion::NextRow(IEJoinUnion *this)

{
  unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *this_00;
  ulong *puVar1;
  size_type __n;
  long lVar2;
  unsigned_long *puVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  pointer pSVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  type sd;
  type pSVar10;
  ulong uVar11;
  SBScanState *this_01;
  bool local_59;
  
  uVar11 = this->i;
  local_59 = uVar11 < this->n;
  if (local_59) {
    this_00 = &this->off2;
    do {
      pvVar5 = vector<unsigned_long,_true>::operator[](&this->p,uVar11);
      __n = *pvVar5;
      pvVar6 = vector<long,_true>::operator[](&this->li,__n);
      lVar2 = *pvVar6;
      this->lrid = lVar2;
      if (-1 < lVar2) {
        pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator->(&this->op2);
        uVar11 = this->i;
        uVar8 = uVar11 / pSVar7->block_capacity;
        if (uVar8 != (pSVar7->scan).block_idx) {
          this_01 = &pSVar7->scan;
          SBScanState::SetIndices(this_01,uVar8,0);
          if (uVar8 < pSVar7->block_count) {
            SBScanState::PinRadix(this_01,(pSVar7->scan).block_idx);
            pdVar9 = SBScanState::RadixPtr(this_01);
            pSVar7->block_ptr = pdVar9;
            if (pSVar7->all_constant == false) {
              sd = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                   operator*(&((pSVar7->scan).sb)->blob_sorting_data);
              SBScanState::PinData(this_01,sd);
            }
          }
        }
        uVar8 = uVar11 % pSVar7->block_capacity;
        (pSVar7->scan).entry_idx = uVar8;
        pSVar7->entry_ptr = pSVar7->block_ptr + uVar8 * pSVar7->entry_size;
        pSVar7->entry_idx = uVar11;
        pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator->(this_00);
        if (pSVar7->entry_idx < this->n) {
          do {
            pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                     operator->(this_00);
            pSVar10 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      ::operator*(&this->op2);
            if (pSVar7->all_constant == true) {
              iVar4 = FastMemcmp(pSVar7->entry_ptr,pSVar10->entry_ptr,
                                 pSVar7->sort_layout->comparison_size);
            }
            else {
              iVar4 = Comparators::CompareTuple
                                (&pSVar7->scan,&pSVar10->scan,&pSVar7->entry_ptr,&pSVar10->entry_ptr
                                 ,pSVar7->sort_layout,&pSVar7->external);
            }
            if (pSVar7->cmp < iVar4) break;
            pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                     operator->(this_00);
            pvVar5 = vector<unsigned_long,_true>::operator[](&this->p,pSVar7->entry_idx);
            uVar11 = *pvVar5;
            pvVar6 = vector<long,_true>::operator[](&this->li,uVar11);
            if (*pvVar6 < 0) {
              puVar3 = (this->bit_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 != (unsigned_long *)0x0) {
                puVar1 = puVar3 + (uVar11 >> 6);
                *puVar1 = *puVar1 | 1L << ((byte)uVar11 & 0x3f);
              }
              puVar3 = (this->bloom_filter).super_TemplatedValidityMask<unsigned_long>.validity_mask
              ;
              if (puVar3 != (unsigned_long *)0x0) {
                puVar1 = puVar3 + (uVar11 >> 0x10);
                *puVar1 = *puVar1 | 1L << ((byte)(uVar11 >> 10) & 0x3f);
              }
            }
            pSVar10 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      ::operator*(this_00);
            SBIterator::operator++(pSVar10);
            pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                     operator->(this_00);
          } while (pSVar7->entry_idx < this->n);
        }
        this->j = __n;
        if (-1 < lVar2) {
          return local_59;
        }
      }
      uVar11 = this->i + 1;
      this->i = uVar11;
      local_59 = uVar11 < this->n;
    } while (local_59);
  }
  return local_59;
}

Assistant:

bool IEJoinUnion::NextRow() {
	for (; i < n; ++i) {
		// 12. pos ← P[i]
		auto pos = p[i];
		lrid = li[pos];
		if (lrid < 0) {
			continue;
		}

		// 16. B[pos] ← 1
		op2->SetIndex(i);
		for (; off2->GetIndex() < n; ++(*off2)) {
			if (!off2->Compare(*op2)) {
				break;
			}
			const auto p2 = p[off2->GetIndex()];
			if (li[p2] < 0) {
				// Only mark rhs matches.
				bit_mask.SetValid(p2);
				bloom_filter.SetValid(p2 / BLOOM_CHUNK_BITS);
			}
		}

		// 9.  if (op1 ∈ {≤,≥} and op2 ∈ {≤,≥}) eqOff = 0
		// 10. else eqOff = 1
		// No, because there could be more than one equal value.
		// Find the leftmost off1 where L1[pos] op1 L1[off1..n]
		// These are the rows that satisfy the op1 condition
		// and that is where we should start scanning B from
		j = pos;

		return true;
	}
	return false;
}